

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall Loop::SetImplicitCallFlags(Loop *this,ImplicitCallFlags newFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *pLVar4;
  
  pLVar4 = this;
  while ((newFlags & ~pLVar4->implicitCallFlags) != ImplicitCall_HasNoInfo) {
    newFlags = newFlags | this->implicitCallFlags;
    pLVar4->implicitCallFlags = newFlags;
    pLVar4 = pLVar4->parent;
    if (pLVar4 == (Loop *)0x0) {
      return;
    }
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    do {
      pLVar4 = pLVar4->parent;
      if (pLVar4 == (Loop *)0x0) {
        return;
      }
    } while ((newFlags & ~pLVar4->implicitCallFlags) == ImplicitCall_HasNoInfo);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xdf2,"((current->implicitCallFlags & newFlags) == newFlags)",
                       "(current->implicitCallFlags & newFlags) == newFlags");
    if (!bVar2) break;
    *puVar3 = 0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
Loop::SetImplicitCallFlags(Js::ImplicitCallFlags newFlags)
{
    Loop * current = this;
    do
    {
        if ((current->implicitCallFlags & newFlags) == newFlags)
        {
#if DBG
            current = current->parent;
            while (current)
            {
                Assert((current->implicitCallFlags & newFlags) == newFlags);
                current = current->parent;
            }
#endif
            break;
        }
        newFlags = (Js::ImplicitCallFlags)(implicitCallFlags | newFlags);
        current->implicitCallFlags = newFlags;
        current = current->parent;
    }
    while (current != nullptr);
}